

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLiSample * __thiscall
pbrt::GoniometricLight::SampleLi
          (LightLiSample *__return_storage_ptr__,GoniometricLight *this,LightSampleContext ctx,
          Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  Interval<float> IVar2;
  bool bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  Point3fi *pPVar6;
  Point3fi *pPVar7;
  uintptr_t iptr;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [56];
  undefined1 auVar23 [16];
  Vector3f wl;
  SampledSpectrum SVar24;
  undefined1 auVar14 [56];
  undefined1 auVar21 [64];
  
  auVar10 = ZEXT816(0) << 0x40;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar10,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]))
  ;
  auVar5 = vfmadd231ss_fma(auVar5,auVar10,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar4 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar10,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar5 = vfmadd231ss_fma(auVar5,auVar10,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar11 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar10,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar5 = vfmadd231ss_fma(auVar5,auVar10,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar8 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)),
                           auVar10,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]))
  ;
  auVar5 = vfmadd231ss_fma(auVar5,auVar10,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar12 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar12 == 1.0;
  auVar9 = ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar12));
  fVar8 = (float)((uint)bVar3 * (int)fVar8 + (uint)!bVar3 * (int)(fVar8 / fVar12));
  auVar5 = vinsertps_avx(auVar9,ZEXT416((uint)bVar3 * (int)fVar11 +
                                        (uint)!bVar3 * (int)(fVar11 / fVar12)),0x10);
  fVar4 = fVar8 + (ctx.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                  ctx.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * -0.5;
  auVar10 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                          ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  auVar16._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar10._0_4_;
  auVar16._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar10._4_4_;
  auVar16._8_4_ = auVar10._8_4_ + 0.0;
  auVar16._12_4_ = auVar10._12_4_ + 0.0;
  auVar10._8_4_ = 0xbf000000;
  auVar10._0_8_ = 0xbf000000bf000000;
  auVar10._12_4_ = 0xbf000000;
  auVar10 = vmulps_avx512vl(auVar16,auVar10);
  auVar23._0_4_ = auVar5._0_4_ + auVar10._0_4_;
  auVar23._4_4_ = auVar5._4_4_ + auVar10._4_4_;
  auVar23._8_4_ = auVar5._8_4_ + auVar10._8_4_;
  auVar23._12_4_ = auVar5._12_4_ + auVar10._12_4_;
  auVar17._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar17._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar17._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar17._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar10 = vmovshdup_avx(auVar17);
  auVar10 = vfmadd231ss_fma(auVar10,auVar23,auVar23);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar11 = auVar10._0_4_;
  if (fVar11 < 0.0) {
    fVar12 = sqrtf(fVar11);
  }
  else {
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    fVar12 = auVar10._0_4_;
  }
  auVar18._4_4_ = fVar12;
  auVar18._0_4_ = fVar12;
  auVar18._8_4_ = fVar12;
  auVar18._12_4_ = fVar12;
  auVar10 = vdivps_avx(auVar23,auVar18);
  auVar23 = ZEXT416((uint)(fVar4 / fVar12));
  auVar16 = vmovshdup_avx(auVar10);
  fVar15 = auVar16._0_4_;
  auVar16 = vfnmsub231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [0][1])),auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar16 = vfnmadd231ss_fma(auVar16,auVar23,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar17 = vfnmsub231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar17 = vfnmadd231ss_fma(auVar17,auVar23,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar16 = vinsertps_avx(auVar16,auVar17,0x10);
  auVar17 = vfnmsub231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar17 = vfnmadd231ss_fma(auVar17,auVar23,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar16._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_;
  auVar22 = ZEXT856(auVar17._8_8_);
  auVar14 = ZEXT856(auVar16._8_8_);
  SVar24 = Scale(this,wl,&lambda);
  auVar21._0_8_ = SVar24.values.values._8_8_;
  auVar21._8_56_ = auVar22;
  auVar13._0_8_ = SVar24.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  auVar16 = vmovlhps_avx(auVar13._0_16_,auVar21._0_16_);
  auVar19._4_4_ = fVar11;
  auVar19._0_4_ = fVar11;
  auVar19._8_4_ = fVar11;
  auVar19._12_4_ = fVar11;
  auVar16 = vdivps_avx(auVar16,auVar19);
  auVar20._4_4_ = fVar8;
  auVar20._0_4_ = fVar8;
  auVar20._8_4_ = fVar8;
  auVar20._12_4_ = fVar8;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x0;
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar16;
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar4 / fVar12;
  __return_storage_ptr__->pdf = 1.0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (ulong)this | 0x4000000000000;
  auVar5 = vshufps_avx(auVar9,auVar5,0x50);
  pPVar6 = &(__return_storage_ptr__->pLight).pi;
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar6->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = (float)(int)auVar5._0_8_;
  (pPVar6->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = (float)(int)auVar5._8_8_;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.high = (float)(int)((ulong)auVar5._8_8_ >> 0x20);
  IVar2 = (Interval<float>)vmovlps_avx(auVar20);
  (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar2;
  (__return_storage_ptr__->pLight).time = 0.0;
  (__return_storage_ptr__->pLight).mediumInterface = &(this->super_LightBase).mediumInterface;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample GoniometricLight::SampleLi(LightSampleContext ctx, Point2f u,
                                         SampledWavelengths lambda,
                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        Scale(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(this, L, wi, 1, Interaction(p, 0 /* time */, &mediumInterface));
}